

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuronTest.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  Izhikevich_param *param;
  SpikeEvent *this;
  ostream *poVar2;
  int i;
  int iVar3;
  Izhikevich n;
  
  param = (Izhikevich_param *)operator_new(0x28);
  param->a = 0.02;
  param->b = 0.2;
  param->c = -65.0;
  param->d = 8.0;
  param->v_thres = 30.0;
  Izhikevich::Izhikevich(&n,0,0,param);
  this = (SpikeEvent *)operator_new(0x18);
  NoEvent::NoEvent((NoEvent *)this);
  iVar3 = 0;
  do {
    if (iVar3 == 500) {
      this = (SpikeEvent *)operator_new(0x28);
      SpikeEvent::SpikeEvent(this);
      this->multiplicity = 1;
      this->weight = 1.0;
    }
    else if (iVar3 == 800) {
      this = (SpikeEvent *)operator_new(0x18);
      NoEvent::NoEvent((NoEvent *)this);
    }
    else if (iVar3 == 0x514) {
      Izhikevich::~Izhikevich(&n);
      return 0;
    }
    Izhikevich::handleEvent(&n,&this->super_Event);
    Izhikevich::update(&n,0.3);
    dVar1 = Izhikevich::getMembranePotential(&n);
    poVar2 = std::ostream::_M_insert<double>(dVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    Izhikevich::resetInput(&n);
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int main() 
{
    Izhikevich_param* p = new Izhikevich_param();
    Izhikevich n = Izhikevich(0, 0, p);
    Event* e = new NoEvent();

    for(int i = 0; i < 1300; i++) {
        if(i == 500) {
            e = new SpikeEvent();
            static_cast<SpikeEvent*>(e)->multiplicity = 1;
            static_cast<SpikeEvent*>(e)->weight = 1.0;
        }
        else if(i == 800) {
            e = new NoEvent();
        }

        n.handleEvent(e);
        n.update(0.3);
        cout << n.getMembranePotential() << endl;
        n.resetInput();
    }
    return 0;
}